

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CaseInsensitive::Transform::Apply<char16_t>(Transform *this,uint c,char16_t *outEquiv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  
  if ((c < this->lo) || (this->hi < c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x29,"(c >= lo && c <= hi)","c >= lo && c <= hi");
    if (!bVar2) goto LAB_00e6bb3b;
    *puVar3 = 0;
  }
  iVar5 = 0;
  if ((this->lo + 1) % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    iVar5 = this->delta0;
  }
  if (0xffff < iVar5 + c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
    if (!bVar2) goto LAB_00e6bb3b;
    *puVar3 = 0;
  }
  *outEquiv = (char16_t)(iVar5 + c);
  if (this->lo % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    uVar6 = this->delta1 + c;
    if (0xffff < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) goto LAB_00e6bb3b;
      *puVar3 = 0;
    }
    outEquiv[1] = (char16_t)uVar6;
    uVar6 = this->delta2 + c;
    if (0xffff < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) goto LAB_00e6bb3b;
      *puVar3 = 0;
    }
    outEquiv[2] = (char16_t)uVar6;
    c = c + this->delta3;
    if (0xffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) {
LAB_00e6bb3b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    lVar4 = 6;
  }
  else {
    if (0xffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar2) goto LAB_00e6bb3b;
      *puVar3 = 0;
    }
    outEquiv[3] = (char16_t)c;
    outEquiv[2] = (char16_t)c;
    lVar4 = 2;
  }
  *(short *)((long)outEquiv + lVar4) = (short)c;
  return;
}

Assistant:

inline void Apply(uint c, Char outEquiv[EquivClassSize]) const
            {
                Assert(c >= lo && c <= hi);

                outEquiv[0] = Chars<Char>::UTC((lo + 1) % skipCountOfRange == c % skipCountOfRange ? (int)c + delta0 : c);

                CompileAssert(CaseInsensitive::EquivClassSize == 4);
                if (lo  % skipCountOfRange == c % skipCountOfRange)
                {
                    outEquiv[1] = Chars<Char>::ITC((int)c + delta1);
                    outEquiv[2] = Chars<Char>::ITC((int)c + delta2);
                    outEquiv[3] = Chars<Char>::ITC((int)c + delta3);
                }
                else
                {
                    outEquiv[1] = outEquiv[2] = outEquiv[3] = Chars<Char>::UTC(c);
                }
            }